

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuMatrix.c
# Opt level: O0

Fxu_Matrix * Fxu_MatrixAllocate(void)

{
  int iVar1;
  Fxu_Matrix *__s;
  Fxu_ListDouble *pFVar2;
  Extra_MmFixed_t *pEVar3;
  Fxu_HeapDouble *pFVar4;
  Fxu_HeapSingle *pFVar5;
  Vec_Ptr_t *pVVar6;
  int nSizeCur;
  int nSizeMax;
  Fxu_Matrix *p;
  
  __s = (Fxu_Matrix *)malloc(0xd0);
  memset(__s,0,0xd0);
  iVar1 = Abc_PrimeCudd(10000);
  __s->nTableSize = iVar1;
  pFVar2 = (Fxu_ListDouble *)malloc((long)__s->nTableSize * 0x18);
  __s->pTable = pFVar2;
  memset(__s->pTable,0,(long)__s->nTableSize * 0x18);
  pEVar3 = Extra_MmFixedStart(0x48);
  __s->pMemMan = pEVar3;
  pFVar4 = Fxu_HeapDoubleStart();
  __s->pHeapDouble = pFVar4;
  pFVar5 = Fxu_HeapSingleStart();
  __s->pHeapSingle = pFVar5;
  pVVar6 = Vec_PtrAlloc(100);
  __s->vPairs = pVVar6;
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Fxu_Matrix * Fxu_MatrixAllocate()
{
	Fxu_Matrix * p;
	p = ABC_ALLOC( Fxu_Matrix, 1 );
	memset( p, 0, sizeof(Fxu_Matrix) );
	p->nTableSize = Abc_PrimeCudd(10000);
	p->pTable = ABC_ALLOC( Fxu_ListDouble, p->nTableSize );
	memset( p->pTable, 0, sizeof(Fxu_ListDouble) * p->nTableSize );
#ifndef USE_SYSTEM_MEMORY_MANAGEMENT
    {
        // get the largest size in bytes for the following structures:
        // Fxu_Cube, Fxu_Var, Fxu_Lit, Fxu_Pair, Fxu_Double, Fxu_Single
        // (currently, Fxu_Var, Fxu_Pair, Fxu_Double take 10 machine words)
        int nSizeMax, nSizeCur;
        nSizeMax = -1;
        nSizeCur = sizeof(Fxu_Cube);
        if ( nSizeMax < nSizeCur )
             nSizeMax = nSizeCur;
        nSizeCur = sizeof(Fxu_Var);
        if ( nSizeMax < nSizeCur )
             nSizeMax = nSizeCur;
        nSizeCur = sizeof(Fxu_Lit);
        if ( nSizeMax < nSizeCur )
             nSizeMax = nSizeCur;
        nSizeCur = sizeof(Fxu_Pair);
        if ( nSizeMax < nSizeCur )
             nSizeMax = nSizeCur;
        nSizeCur = sizeof(Fxu_Double);
        if ( nSizeMax < nSizeCur )
             nSizeMax = nSizeCur;
        nSizeCur = sizeof(Fxu_Single);
        if ( nSizeMax < nSizeCur )
             nSizeMax = nSizeCur;
    	p->pMemMan  = Extra_MmFixedStart( nSizeMax ); 
    }
#endif
	p->pHeapDouble = Fxu_HeapDoubleStart();
	p->pHeapSingle = Fxu_HeapSingleStart();
    p->vPairs = Vec_PtrAlloc( 100 );
	return p;
}